

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O3

int splittingStep_WriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  int iVar1;
  
  if (ark_mem->step_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"splittingStep_WriteParameters",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    iVar1 = 0;
    fprintf((FILE *)fp,"SplittingStep time step module parameters:\n  Method order %i\n\n",
            (ulong)*(uint *)((long)ark_mem->step_mem + 0x1c));
  }
  return iVar1;
}

Assistant:

static int splittingStep_WriteParameters(ARKodeMem ark_mem, FILE* fp)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  fprintf(fp, "SplittingStep time step module parameters:\n  Method order %i\n\n",
          step_mem->order);

  return ARK_SUCCESS;
}